

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

void dynet::TensorTools::accumulate_dev<dynet::Device_CPU>(Device_CPU *dev,Tensor *v,Tensor *v_src)

{
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar1;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *in_stack_00000008;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_00000010;
  Tensor *in_stack_ffffffffffffffb8;
  
  Tensor::tvec(in_stack_ffffffffffffffb8);
  TVar1 = Tensor::tvec(in_stack_ffffffffffffffb8);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)TVar1.m_dimensions.super_array<long,_1>._M_elems[0].super_array<long,_1>,
             (DefaultDevice *)TVar1.m_data);
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator+=(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void TensorTools::accumulate_dev(const MyDevice & dev, Tensor& v, const Tensor& v_src) {
  DYNET_ASSERT(v.d.size() == v_src.d.size(), "TensorTools::accumulate can only be used with tensors of identical size");
  v.tvec().device(*dev.edevice) += v_src.tvec();
}